

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

bool __thiscall
cfd::TransactionContext::IsFindTxIn(TransactionContext *this,OutPoint *outpoint,uint32_t *index)

{
  undefined4 uVar1;
  undefined4 *in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  string errmsg;
  CfdException *except;
  uint32_t temp_index;
  
  uVar1 = (**(code **)(*in_RDI + 0x78))(in_RDI,in_RSI);
  if (in_RDX != (undefined4 *)0x0) {
    *in_RDX = uVar1;
  }
  return true;
}

Assistant:

bool TransactionContext::IsFindTxIn(
    const OutPoint& outpoint, uint32_t* index) const {
  static constexpr const char* const kErrorMessage = "Txid is not found.";
  try {
    uint32_t temp_index = GetTxInIndex(outpoint);
    if (index != nullptr) *index = temp_index;
    return true;
  } catch (const CfdException& except) {
    std::string errmsg(except.what());
    if (errmsg == kErrorMessage) {
      return false;
    } else {
      throw except;
    }
  }
}